

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O3

resource loader::anon_unknown_0::ne_reader::find_resource(istream *is,uint32_t name,uint32_t type)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  ushort uVar5;
  uint uVar6;
  char buffer [2];
  ushort local_46;
  uint32_t local_44;
  ulong local_40;
  uint local_34;
  
  std::istream::seekg((long)is,0x22);
  std::istream::read((char *)is,(long)&local_46);
  uVar1 = local_46;
  uVar6 = (uint)local_46;
  std::istream::read((char *)is,(long)&local_46);
  local_40 = 0;
  if (local_46 != uVar1) {
    uVar4 = 0;
    if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0)
    goto LAB_0013313a;
    local_44 = name;
    std::istream::seekg((long)is,uVar6 - 0x28);
    std::istream::read((char *)is,(long)&local_46);
    local_40 = 0;
    local_34 = (uint)local_46;
    if (local_34 < 0x20) {
      uVar4 = 0;
      if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0)
      goto LAB_0013313a;
      local_40 = 0;
      while( true ) {
        std::istream::read((char *)is,(long)&local_46);
        uVar1 = local_46;
        std::istream::read((char *)is,(long)&local_46);
        uVar5 = local_46;
        std::istream::seekg((long)is,4);
        if (uVar1 == 0) break;
        uVar4 = 0;
        if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0)
        goto LAB_0013313a;
        if ((type & 0xffff | 0x8000) == (uint)uVar1) {
          if (uVar5 != 0) {
            local_44 = local_44 & 0xffff | 0x8000;
            local_40 = 0;
            goto LAB_001330a4;
          }
          local_40 = 0;
          break;
        }
        std::istream::seekg((long)is,(uint)uVar5 * 0xc);
      }
    }
  }
LAB_00133138:
  uVar4 = 0;
  goto LAB_0013313a;
  while( true ) {
    uVar4 = 0;
    uVar5 = uVar5 - 1;
    if (uVar5 == 0) break;
LAB_001330a4:
    std::istream::read((char *)is,(long)&local_46);
    uVar1 = local_46;
    std::istream::read((char *)is,(long)&local_46);
    uVar2 = local_46;
    std::istream::seekg((long)is,_S_end);
    std::istream::read((char *)is,(long)&local_46);
    uVar3 = local_46;
    std::istream::seekg((long)is,4);
    if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) != 0) goto LAB_00133138;
    if (local_44 == uVar3) {
      local_40 = (ulong)((uint)uVar1 << ((byte)local_34 & 0x1f));
      uVar4 = (ulong)((uint)uVar2 << ((byte)local_34 & 0x1f)) << 0x20;
      break;
    }
  }
LAB_0013313a:
  return (resource)(local_40 | uVar4);
}

Assistant:

exe_reader::resource ne_reader::find_resource(std::istream & is, boost::uint32_t name,
                                              boost::uint32_t type) {
	
	resource result;
	result.offset = result.size = 0;
	
	is.seekg(0x24 - 2, std::ios_base::cur); // Already read the magic
	boost::uint16_t resources_offset = util::load<boost::uint16_t>(is);
	boost::uint16_t resources_end = util::load<boost::uint16_t>(is);
	if(is.fail()) {
		return result;
	}
	
	if(resources_end == resources_offset) {
		return result;
	}
	
	is.seekg(std::streamoff(resources_offset) - 0x28, std::ios_base::cur);
	
	boost::uint16_t shift = util::load<boost::uint16_t>(is);
	if(is.fail() || shift >= 32) {
		return result;
	}
	
	boost::uint16_t name_count;
	for(;;) {
		
		boost::uint16_t type_id = util::load<boost::uint16_t>(is);
		name_count = util::load<boost::uint16_t>(is);
		is.seekg(4, std::ios_base::cur);
		if(is.fail() || type_id == 0) {
			return result;
		}
		
		if(type_id == boost::uint16_t(type | 0x8000)) {
			break;
		}
		
		is.seekg(name_count * 12, std::ios_base::cur);
		
	}
	
	for(boost::uint16_t i = 0; i < name_count; i++) {
		
		boost::uint16_t offset = util::load<boost::uint16_t>(is);
		boost::uint16_t size   = util::load<boost::uint16_t>(is);
		is.seekg(2, std::ios_base::cur);
		boost::uint16_t name_id = util::load<boost::uint16_t>(is);
		is.seekg(4, std::ios_base::cur);
		if(is.fail()) {
			return result;
		}
		
		if(name_id == boost::uint16_t(name | 0x8000)) {
			result.offset = boost::uint32_t(offset) << shift;
			result.size   = boost::uint32_t(size)   << shift;
			break;
		}
		
	}
	
	return result;
}